

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BrepFaceIntegrationPoints.h
# Opt level: O3

IntegrationPointList<2> *
anurbs::BrepFaceIntegrationPoints::get
          (IntegrationPointList<2> *__return_storage_ptr__,BrepFace *face,double tolerance)

{
  double *__args_2;
  pointer pMVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var3;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this;
  long *plVar4;
  element_type *peVar5;
  element_type *peVar6;
  long lVar7;
  long lVar8;
  pointer pIVar9;
  pointer pIVar10;
  element_type *peVar11;
  element_type *peVar12;
  long lVar13;
  pointer pIVar14;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var15;
  pointer pIVar16;
  double dVar17;
  double dVar18;
  double dVar19;
  double dVar20;
  IntegrationPointList<2> points_1;
  IntegrationPointList<2> points;
  vector<Eigen::Matrix<double,_1,_3,_1,_1,_3>,_std::allocator<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>_>
  ders;
  vector<Eigen::Matrix<double,_1,_3,_1,_1,_3>,_std::allocator<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>_>
  ders_1;
  TrimmedSurfaceClipping clipper;
  vector<anurbs::Interval,_std::allocator<anurbs::Interval>_> local_158;
  vector<anurbs::Interval,_std::allocator<anurbs::Interval>_> local_140;
  BrepTrim local_128;
  long local_e0;
  TrimmedSurfaceClipping local_d8;
  size_t local_48;
  size_t local_40;
  double local_38;
  
  local_d8.m_tolerance = tolerance * 10.0;
  local_d8.m_scale = tolerance / 10.0;
  local_d8.m_span_polygons.
  super__Vector_base<std::vector<anurbs::Polygon,_std::allocator<anurbs::Polygon>_>,_std::allocator<std::vector<anurbs::Polygon,_std::allocator<anurbs::Polygon>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_d8.m_span_polygons.
  super__Vector_base<std::vector<anurbs::Polygon,_std::allocator<anurbs::Polygon>_>,_std::allocator<std::vector<anurbs::Polygon,_std::allocator<anurbs::Polygon>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_d8.m_span_polygons.
  super__Vector_base<std::vector<anurbs::Polygon,_std::allocator<anurbs::Polygon>_>,_std::allocator<std::vector<anurbs::Polygon,_std::allocator<anurbs::Polygon>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_d8.m_span_trim_type.
  super__Vector_base<anurbs::TrimTypes,_std::allocator<anurbs::TrimTypes>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_d8.m_span_trim_type.
  super__Vector_base<anurbs::TrimTypes,_std::allocator<anurbs::TrimTypes>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_d8.m_paths.
  super__Vector_base<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>,_std::allocator<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_d8.m_span_trim_type.
  super__Vector_base<anurbs::TrimTypes,_std::allocator<anurbs::TrimTypes>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_d8.m_paths.
  super__Vector_base<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>,_std::allocator<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_d8.m_paths.
  super__Vector_base<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>,_std::allocator<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_d8.m_spans_u.super__Vector_base<anurbs::Interval,_std::allocator<anurbs::Interval>_>._M_impl
  .super__Vector_impl_data._M_start = (pointer)0x0;
  local_d8.m_spans_u.super__Vector_base<anurbs::Interval,_std::allocator<anurbs::Interval>_>._M_impl
  .super__Vector_impl_data._M_finish = (pointer)0x0;
  local_d8.m_spans_u.super__Vector_base<anurbs::Interval,_std::allocator<anurbs::Interval>_>._M_impl
  .super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_d8.m_spans_v.super__Vector_base<anurbs::Interval,_std::allocator<anurbs::Interval>_>._M_impl
  .super__Vector_impl_data._M_start = (pointer)0x0;
  local_d8.m_spans_v.super__Vector_base<anurbs::Interval,_std::allocator<anurbs::Interval>_>._M_impl
  .super__Vector_impl_data._M_finish = (pointer)0x0;
  local_d8.m_spans_v.super__Vector_base<anurbs::Interval,_std::allocator<anurbs::Interval>_>._M_impl
  .super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::tuple<double,_double,_double>,_std::allocator<std::tuple<double,_double,_double>_>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::tuple<double,_double,_double>,_std::allocator<std::tuple<double,_double,_double>_>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::tuple<double,_double,_double>,_std::allocator<std::tuple<double,_double,_double>_>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_128.m_edge.m_entry.
  super___shared_ptr<anurbs::Entry<anurbs::BrepEdge>,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
       = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)face;
  std::vector<anurbs::Ref<anurbs::BrepLoop>,_std::allocator<anurbs::Ref<anurbs::BrepLoop>_>_>::
  vector((vector<anurbs::Ref<anurbs::BrepLoop>,_std::allocator<anurbs::Ref<anurbs::BrepLoop>_>_> *)
         &local_140,&face->m_loops);
  local_128.m_curve_geometry.m_entry.
  super___shared_ptr<anurbs::Entry<anurbs::NurbsCurveGeometry<2L>_>,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = (element_type *)
           local_140.super__Vector_base<anurbs::Interval,_std::allocator<anurbs::Interval>_>._M_impl
           .super__Vector_impl_data._M_finish;
  peVar12 = (element_type *)
            local_140.super__Vector_base<anurbs::Interval,_std::allocator<anurbs::Interval>_>.
            _M_impl.super__Vector_impl_data._M_start;
  if (local_140.super__Vector_base<anurbs::Interval,_std::allocator<anurbs::Interval>_>._M_impl.
      super__Vector_impl_data._M_start !=
      local_140.super__Vector_base<anurbs::Interval,_std::allocator<anurbs::Interval>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    do {
      pMVar1 = (((Path *)&peVar12->super_EntryBase)->
               super__Vector_base<Eigen::Matrix<double,_1,_2,_1,_1,_2>,_std::allocator<Eigen::Matrix<double,_1,_2,_1,_1,_2>_>_>
               )._M_impl.super__Vector_impl_data._M_start;
      p_Var2 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(peVar12->m_key)._M_dataplus._M_p;
      if (p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          p_Var2->_M_use_count = p_Var2->_M_use_count + 1;
          UNLOCK();
        }
        else {
          p_Var2->_M_use_count = p_Var2->_M_use_count + 1;
        }
      }
      TrimmedSurfaceClipping::begin_loop(&local_d8);
      dVar17 = pMVar1[2].super_PlainObjectBase<Eigen::Matrix<double,_1,_2,_1,_1,_2>_>.m_storage.
               m_data.array[1];
      p_Var3 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               pMVar1[3].super_PlainObjectBase<Eigen::Matrix<double,_1,_2,_1,_1,_2>_>.m_storage.
               m_data.array[0];
      if (p_Var3 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          p_Var3->_M_use_count = p_Var3->_M_use_count + 1;
          UNLOCK();
        }
        else {
          p_Var3->_M_use_count = p_Var3->_M_use_count + 1;
        }
      }
      std::vector<anurbs::Ref<anurbs::BrepTrim>,_std::allocator<anurbs::Ref<anurbs::BrepTrim>_>_>::
      vector((vector<anurbs::Ref<anurbs::BrepTrim>,_std::allocator<anurbs::Ref<anurbs::BrepTrim>_>_>
              *)&local_158,
             (vector<anurbs::Ref<anurbs::BrepTrim>,_std::allocator<anurbs::Ref<anurbs::BrepTrim>_>_>
              *)((long)dVar17 + 0x10));
      pIVar14 = local_158.super__Vector_base<anurbs::Interval,_std::allocator<anurbs::Interval>_>.
                _M_impl.super__Vector_impl_data._M_start;
      pIVar16 = local_158.super__Vector_base<anurbs::Interval,_std::allocator<anurbs::Interval>_>.
                _M_impl.super__Vector_impl_data._M_finish;
      local_128.m_curve_geometry.m_entry.
      super___shared_ptr<anurbs::Entry<anurbs::NurbsCurveGeometry<2L>_>,_(__gnu_cxx::_Lock_policy)2>
      ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)peVar12;
      if (p_Var3 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var3);
        pIVar14 = local_158.super__Vector_base<anurbs::Interval,_std::allocator<anurbs::Interval>_>.
                  _M_impl.super__Vector_impl_data._M_start;
        pIVar16 = local_158.super__Vector_base<anurbs::Interval,_std::allocator<anurbs::Interval>_>.
                  _M_impl.super__Vector_impl_data._M_finish;
      }
      for (; pIVar9 = local_158.
                      super__Vector_base<anurbs::Interval,_std::allocator<anurbs::Interval>_>.
                      _M_impl.super__Vector_impl_data._M_finish,
          pIVar14 !=
          local_158.super__Vector_base<anurbs::Interval,_std::allocator<anurbs::Interval>_>._M_impl.
          super__Vector_impl_data._M_finish; pIVar14 = pIVar14 + 1) {
        dVar17 = (((PlainObjectBase<Eigen::Matrix<double,_1,_2,_1,_1,_2>_> *)&pIVar14->m_t0)->
                 m_storage).m_data.array[0];
        p_Var3 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)pIVar14->m_t1;
        if (p_Var3 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            p_Var3->_M_use_count = p_Var3->_M_use_count + 1;
            UNLOCK();
          }
          else {
            p_Var3->_M_use_count = p_Var3->_M_use_count + 1;
          }
        }
        this = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)((long)dVar17 + 0x30);
        if (this != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            this->_M_use_count = this->_M_use_count + 1;
            UNLOCK();
          }
          else {
            this->_M_use_count = this->_M_use_count + 1;
          }
        }
        local_158.super__Vector_base<anurbs::Interval,_std::allocator<anurbs::Interval>_>._M_impl.
        super__Vector_impl_data._M_finish = pIVar16;
        BrepTrim::curve_2d(&local_128);
        TrimmedSurfaceClipping::add_curve
                  (&local_d8,
                   (CurveBase<2L> *)
                   local_128.m_loop.m_entry.
                   super___shared_ptr<anurbs::Entry<anurbs::BrepLoop>,_(__gnu_cxx::_Lock_policy)2>.
                   _M_ptr);
        if (local_128.m_loop.m_entry.
            super___shared_ptr<anurbs::Entry<anurbs::BrepLoop>,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    (local_128.m_loop.m_entry.
                     super___shared_ptr<anurbs::Entry<anurbs::BrepLoop>,_(__gnu_cxx::_Lock_policy)2>
                     ._M_refcount._M_pi);
        }
        if (this != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this);
        }
        if (p_Var3 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var3);
        }
        pIVar16 = local_158.super__Vector_base<anurbs::Interval,_std::allocator<anurbs::Interval>_>.
                  _M_impl.super__Vector_impl_data._M_finish;
        local_158.super__Vector_base<anurbs::Interval,_std::allocator<anurbs::Interval>_>._M_impl.
        super__Vector_impl_data._M_finish = pIVar9;
      }
      local_158.super__Vector_base<anurbs::Interval,_std::allocator<anurbs::Interval>_>._M_impl.
      super__Vector_impl_data._M_finish = pIVar16;
      std::vector<anurbs::Ref<anurbs::BrepTrim>,_std::allocator<anurbs::Ref<anurbs::BrepTrim>_>_>::
      ~vector((vector<anurbs::Ref<anurbs::BrepTrim>,_std::allocator<anurbs::Ref<anurbs::BrepTrim>_>_>
               *)&local_158);
      ClipperLib::CleanPolygon
                (local_d8.m_paths.
                 super__Vector_base<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>,_std::allocator<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish + -1,1.415);
      _Var15._M_pi = local_128.m_curve_geometry.m_entry.
                     super___shared_ptr<anurbs::Entry<anurbs::NurbsCurveGeometry<2L>_>,_(__gnu_cxx::_Lock_policy)2>
                     ._M_refcount._M_pi;
      if (p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var2);
      }
      peVar12 = (element_type *)(_Var15._M_pi + 1);
    } while ((element_type *)(_Var15._M_pi + 1) !=
             local_128.m_curve_geometry.m_entry.
             super___shared_ptr<anurbs::Entry<anurbs::NurbsCurveGeometry<2L>_>,_(__gnu_cxx::_Lock_policy)2>
             ._M_ptr);
  }
  std::vector<anurbs::Ref<anurbs::BrepLoop>,_std::allocator<anurbs::Ref<anurbs::BrepLoop>_>_>::
  ~vector((vector<anurbs::Ref<anurbs::BrepLoop>,_std::allocator<anurbs::Ref<anurbs::BrepLoop>_>_> *)
          &local_140);
  lVar13 = *(long *)&local_128.m_edge.m_entry.
                     super___shared_ptr<anurbs::Entry<anurbs::BrepEdge>,_(__gnu_cxx::_Lock_policy)2>
                     ._M_refcount._M_pi[2]._M_use_count;
  p_Var2 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
           local_128.m_edge.m_entry.
           super___shared_ptr<anurbs::Entry<anurbs::BrepEdge>,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi[3]._vptr__Sp_counted_base;
  if (p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var2->_M_use_count = p_Var2->_M_use_count + 1;
      UNLOCK();
    }
    else {
      p_Var2->_M_use_count = p_Var2->_M_use_count + 1;
    }
  }
  plVar4 = *(long **)(lVar13 + 0x28);
  p_Var3 = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(lVar13 + 0x30);
  if (p_Var3 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var3->_M_use_count = p_Var3->_M_use_count + 1;
      UNLOCK();
    }
    else {
      p_Var3->_M_use_count = p_Var3->_M_use_count + 1;
    }
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var3);
  }
  if (p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var2);
  }
  (**(code **)(*plVar4 + 0x40))(&local_140,plVar4);
  (**(code **)(*plVar4 + 0x48))(&local_158,plVar4);
  TrimmedSurfaceClipping::compute(&local_d8,&local_140,&local_158);
  if (local_158.super__Vector_base<anurbs::Interval,_std::allocator<anurbs::Interval>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_158.
                    super__Vector_base<anurbs::Interval,_std::allocator<anurbs::Interval>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_158.
                          super__Vector_base<anurbs::Interval,_std::allocator<anurbs::Interval>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_158.
                          super__Vector_base<anurbs::Interval,_std::allocator<anurbs::Interval>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  if ((element_type *)
      local_140.super__Vector_base<anurbs::Interval,_std::allocator<anurbs::Interval>_>._M_impl.
      super__Vector_impl_data._M_start != (element_type *)0x0) {
    operator_delete(local_140.
                    super__Vector_base<anurbs::Interval,_std::allocator<anurbs::Interval>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_140.
                          super__Vector_base<anurbs::Interval,_std::allocator<anurbs::Interval>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_140.
                          super__Vector_base<anurbs::Interval,_std::allocator<anurbs::Interval>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  lVar7 = (**(code **)(*plVar4 + 0x10))(plVar4);
  lVar8 = (**(code **)(*plVar4 + 0x18))(plVar4);
  lVar13 = lVar8;
  if (lVar8 < lVar7) {
    lVar13 = lVar7;
  }
  pIVar14 = local_d8.m_spans_v.
            super__Vector_base<anurbs::Interval,_std::allocator<anurbs::Interval>_>._M_impl.
            super__Vector_impl_data._M_start;
  pIVar16 = local_d8.m_spans_u.
            super__Vector_base<anurbs::Interval,_std::allocator<anurbs::Interval>_>._M_impl.
            super__Vector_impl_data._M_start;
  if (local_d8.m_spans_u.super__Vector_base<anurbs::Interval,_std::allocator<anurbs::Interval>_>.
      _M_impl.super__Vector_impl_data._M_finish !=
      local_d8.m_spans_u.super__Vector_base<anurbs::Interval,_std::allocator<anurbs::Interval>_>.
      _M_impl.super__Vector_impl_data._M_start &&
      -1 < (long)local_d8.m_spans_u.
                 super__Vector_base<anurbs::Interval,_std::allocator<anurbs::Interval>_>._M_impl.
                 super__Vector_impl_data._M_finish -
           (long)local_d8.m_spans_u.
                 super__Vector_base<anurbs::Interval,_std::allocator<anurbs::Interval>_>._M_impl.
                 super__Vector_impl_data._M_start) {
    peVar12 = (element_type *)(lVar13 + 1);
    local_40 = lVar7 + 1;
    local_48 = lVar8 + 1;
    dVar17 = 0.0;
    __args_2 = &local_128.m_domain.m_t1;
    pIVar9 = local_d8.m_spans_u.
             super__Vector_base<anurbs::Interval,_std::allocator<anurbs::Interval>_>._M_impl.
             super__Vector_impl_data._M_finish;
    pIVar10 = local_d8.m_spans_v.
              super__Vector_base<anurbs::Interval,_std::allocator<anurbs::Interval>_>._M_impl.
              super__Vector_impl_data._M_finish;
    local_128.m_curve_geometry.m_entry.
    super___shared_ptr<anurbs::Entry<anurbs::NurbsCurveGeometry<2L>_>,_(__gnu_cxx::_Lock_policy)2>.
    _M_ptr = peVar12;
    do {
      lVar13 = (long)pIVar10 - (long)pIVar14 >> 4;
      if (0 < lVar13) {
        _Var15._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        local_128.m_domain.m_t0 = dVar17;
        do {
          if (local_d8.m_span_trim_type.
              super__Vector_base<anurbs::TrimTypes,_std::allocator<anurbs::TrimTypes>_>._M_impl.
              super__Vector_impl_data._M_start
              [(long)((long)&(((BrepFace *)_Var15._M_pi)->m_brep).m_entry.
                             super___shared_ptr<anurbs::Entry<anurbs::Brep>,_(__gnu_cxx::_Lock_policy)2>
                             ._M_ptr + lVar13 * (long)dVar17)] != Empty) {
            local_128.m_edge.m_entry.
            super___shared_ptr<anurbs::Entry<anurbs::BrepEdge>,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi = _Var15._M_pi;
            if (local_d8.m_span_trim_type.
                super__Vector_base<anurbs::TrimTypes,_std::allocator<anurbs::TrimTypes>_>._M_impl.
                super__Vector_impl_data._M_start
                [(long)((long)&(((BrepFace *)_Var15._M_pi)->m_brep).m_entry.
                               super___shared_ptr<anurbs::Entry<anurbs::Brep>,_(__gnu_cxx::_Lock_policy)2>
                               ._M_ptr + lVar13 * (long)dVar17)] == Full) {
              local_158.super__Vector_base<anurbs::Interval,_std::allocator<anurbs::Interval>_>.
              _M_impl.super__Vector_impl_data._M_start =
                   (pointer)local_d8.m_spans_u.
                            super__Vector_base<anurbs::Interval,_std::allocator<anurbs::Interval>_>.
                            _M_impl.super__Vector_impl_data._M_start[(long)dVar17].m_t0;
              local_158.super__Vector_base<anurbs::Interval,_std::allocator<anurbs::Interval>_>.
              _M_impl.super__Vector_impl_data._M_finish =
                   (pointer)local_d8.m_spans_u.
                            super__Vector_base<anurbs::Interval,_std::allocator<anurbs::Interval>_>.
                            _M_impl.super__Vector_impl_data._M_start[(long)dVar17].m_t1;
              local_128.m_loop.m_entry.
              super___shared_ptr<anurbs::Entry<anurbs::BrepLoop>,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                   = (element_type *)pIVar14[(long)_Var15._M_pi].m_t0;
              local_128.m_loop.m_entry.
              super___shared_ptr<anurbs::Entry<anurbs::BrepLoop>,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi =
                   (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)pIVar14[(long)_Var15._M_pi].m_t1;
              IntegrationPoints::get
                        ((IntegrationPointList<2> *)&local_140,local_40,local_48,
                         (Interval *)&local_158,(Interval *)&local_128);
              pIVar14 = local_140.
                        super__Vector_base<anurbs::Interval,_std::allocator<anurbs::Interval>_>.
                        _M_impl.super__Vector_impl_data._M_finish;
              for (peVar11 = (element_type *)
                             local_140.
                             super__Vector_base<anurbs::Interval,_std::allocator<anurbs::Interval>_>
                             ._M_impl.super__Vector_impl_data._M_start;
                  peVar11 != (element_type *)pIVar14;
                  peVar11 = (element_type *)&(peVar11->m_key).field_2) {
                local_158.super__Vector_base<anurbs::Interval,_std::allocator<anurbs::Interval>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage =
                     (pointer)(peVar11->m_key)._M_string_length;
                local_158.super__Vector_base<anurbs::Interval,_std::allocator<anurbs::Interval>_>.
                _M_impl.super__Vector_impl_data._M_start =
                     (pointer)(((Path *)&peVar11->super_EntryBase)->
                              super__Vector_base<Eigen::Matrix<double,_1,_2,_1,_1,_2>,_std::allocator<Eigen::Matrix<double,_1,_2,_1,_1,_2>_>_>
                              )._M_impl.super__Vector_impl_data._M_start;
                local_158.super__Vector_base<anurbs::Interval,_std::allocator<anurbs::Interval>_>.
                _M_impl.super__Vector_impl_data._M_finish =
                     (pointer)(peVar11->m_key)._M_dataplus._M_p;
                (**(code **)(*plVar4 + 0x38))
                          ((int)local_158.
                                super__Vector_base<anurbs::Interval,_std::allocator<anurbs::Interval>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage,
                           local_158.
                           super__Vector_base<anurbs::Interval,_std::allocator<anurbs::Interval>_>.
                           _M_impl.super__Vector_impl_data._M_finish,&local_128,plVar4,1);
                dVar17 = *(double *)
                          &((local_128.m_loop.m_entry.
                             super___shared_ptr<anurbs::Entry<anurbs::BrepLoop>,_(__gnu_cxx::_Lock_policy)2>
                            ._M_ptr)->m_key).field_2;
                p_Var2 = ((local_128.m_loop.m_entry.
                           super___shared_ptr<anurbs::Entry<anurbs::BrepLoop>,_(__gnu_cxx::_Lock_policy)2>
                          ._M_ptr)->m_data).
                         super___shared_ptr<anurbs::BrepLoop,_(__gnu_cxx::_Lock_policy)2>.
                         _M_refcount._M_pi;
                dVar19 = *(double *)
                          ((long)&((local_128.m_loop.m_entry.
                                    super___shared_ptr<anurbs::Entry<anurbs::BrepLoop>,_(__gnu_cxx::_Lock_policy)2>
                                   ._M_ptr)->m_key).field_2 + 8);
                peVar5 = ((local_128.m_loop.m_entry.
                           super___shared_ptr<anurbs::Entry<anurbs::BrepLoop>,_(__gnu_cxx::_Lock_policy)2>
                          ._M_ptr)->m_data).
                         super___shared_ptr<anurbs::BrepLoop,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
                peVar6 = ((local_128.m_loop.m_entry.
                           super___shared_ptr<anurbs::Entry<anurbs::BrepLoop>,_(__gnu_cxx::_Lock_policy)2>
                          ._M_ptr)->m_attributes).
                         super___shared_ptr<anurbs::Attributes,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
                p_Var3 = ((local_128.m_loop.m_entry.
                           super___shared_ptr<anurbs::Entry<anurbs::BrepLoop>,_(__gnu_cxx::_Lock_policy)2>
                          ._M_ptr)->m_attributes).
                         super___shared_ptr<anurbs::Attributes,_(__gnu_cxx::_Lock_policy)2>.
                         _M_refcount._M_pi;
                dVar18 = (double)p_Var3 * dVar19 - (double)peVar5 * (double)peVar6;
                dVar20 = (double)p_Var2 * (double)peVar5 - dVar17 * (double)p_Var3;
                dVar17 = dVar17 * (double)peVar6 - (double)p_Var2 * dVar19;
                local_128.m_domain.m_t1 =
                     SQRT(dVar17 * dVar17 + dVar20 * dVar20 + dVar18 * dVar18) *
                     (double)local_158.
                             super__Vector_base<anurbs::Interval,_std::allocator<anurbs::Interval>_>
                             ._M_impl.super__Vector_impl_data._M_start;
                std::
                vector<std::tuple<double,double,double>,std::allocator<std::tuple<double,double,double>>>
                ::emplace_back<double_const&,double_const&,double>
                          ((vector<std::tuple<double,double,double>,std::allocator<std::tuple<double,double,double>>>
                            *)__return_storage_ptr__,
                           (double *)
                           &local_158.
                            super__Vector_base<anurbs::Interval,_std::allocator<anurbs::Interval>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage,
                           (double *)
                           &local_158.
                            super__Vector_base<anurbs::Interval,_std::allocator<anurbs::Interval>_>.
                            _M_impl.super__Vector_impl_data._M_finish,__args_2);
                if (local_128.m_loop.m_entry.
                    super___shared_ptr<anurbs::Entry<anurbs::BrepLoop>,_(__gnu_cxx::_Lock_policy)2>.
                    _M_ptr != (element_type *)0x0) {
                  operator_delete(local_128.m_loop.m_entry.
                                  super___shared_ptr<anurbs::Entry<anurbs::BrepLoop>,_(__gnu_cxx::_Lock_policy)2>
                                  ._M_ptr,(long)local_128.m_edge.m_entry.
                                                super___shared_ptr<anurbs::Entry<anurbs::BrepEdge>,_(__gnu_cxx::_Lock_policy)2>
                                                ._M_ptr -
                                          (long)local_128.m_loop.m_entry.
                                                super___shared_ptr<anurbs::Entry<anurbs::BrepLoop>,_(__gnu_cxx::_Lock_policy)2>
                                                ._M_ptr);
                }
              }
              _Var15._M_pi = local_128.m_edge.m_entry.
                             super___shared_ptr<anurbs::Entry<anurbs::BrepEdge>,_(__gnu_cxx::_Lock_policy)2>
                             ._M_refcount._M_pi;
              dVar17 = local_128.m_domain.m_t0;
              if ((element_type *)
                  local_140.super__Vector_base<anurbs::Interval,_std::allocator<anurbs::Interval>_>.
                  _M_impl.super__Vector_impl_data._M_start != (element_type *)0x0) {
                operator_delete(local_140.
                                super__Vector_base<anurbs::Interval,_std::allocator<anurbs::Interval>_>
                                ._M_impl.super__Vector_impl_data._M_start,
                                (long)local_140.
                                      super__Vector_base<anurbs::Interval,_std::allocator<anurbs::Interval>_>
                                      ._M_impl.super__Vector_impl_data._M_end_of_storage -
                                (long)local_140.
                                      super__Vector_base<anurbs::Interval,_std::allocator<anurbs::Interval>_>
                                      ._M_impl.super__Vector_impl_data._M_start);
                _Var15._M_pi = local_128.m_edge.m_entry.
                               super___shared_ptr<anurbs::Entry<anurbs::BrepEdge>,_(__gnu_cxx::_Lock_policy)2>
                               ._M_refcount._M_pi;
                dVar17 = local_128.m_domain.m_t0;
              }
            }
            else {
              std::vector<anurbs::Polygon,_std::allocator<anurbs::Polygon>_>::vector
                        ((vector<anurbs::Polygon,_std::allocator<anurbs::Polygon>_> *)&local_140,
                         local_d8.m_span_polygons.
                         super__Vector_base<std::vector<anurbs::Polygon,_std::allocator<anurbs::Polygon>_>,_std::allocator<std::vector<anurbs::Polygon,_std::allocator<anurbs::Polygon>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start +
                         (long)((long)&(((BrepFace *)_Var15._M_pi)->m_brep).m_entry.
                                       super___shared_ptr<anurbs::Entry<anurbs::Brep>,_(__gnu_cxx::_Lock_policy)2>
                                       ._M_ptr + lVar13 * (long)dVar17));
              local_128.m_curve_geometry.m_entry.
              super___shared_ptr<anurbs::Entry<anurbs::NurbsCurveGeometry<2L>_>,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount._M_pi =
                   (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                   local_140.super__Vector_base<anurbs::Interval,_std::allocator<anurbs::Interval>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
              peVar11 = (element_type *)
                        local_140.
                        super__Vector_base<anurbs::Interval,_std::allocator<anurbs::Interval>_>.
                        _M_impl.super__Vector_impl_data._M_start;
              if (local_140.super__Vector_base<anurbs::Interval,_std::allocator<anurbs::Interval>_>.
                  _M_impl.super__Vector_impl_data._M_start !=
                  local_140.super__Vector_base<anurbs::Interval,_std::allocator<anurbs::Interval>_>.
                  _M_impl.super__Vector_impl_data._M_finish) {
                do {
                  PolygonIntegrationPoints::get
                            ((IntegrationPointList<2> *)&local_158,(Index)peVar12,(Polygon *)peVar11
                            );
                  pIVar16 = local_158.
                            super__Vector_base<anurbs::Interval,_std::allocator<anurbs::Interval>_>.
                            _M_impl.super__Vector_impl_data._M_finish;
                  for (pIVar14 = local_158.
                                 super__Vector_base<anurbs::Interval,_std::allocator<anurbs::Interval>_>
                                 ._M_impl.super__Vector_impl_data._M_start; pIVar14 != pIVar16;
                      pIVar14 = (pointer)&pIVar14[1].m_t1) {
                    local_128.m_edge.m_entry.
                    super___shared_ptr<anurbs::Entry<anurbs::BrepEdge>,_(__gnu_cxx::_Lock_policy)2>.
                    _M_ptr = (element_type *)
                             (((PlainObjectBase<Eigen::Matrix<double,_1,_2,_1,_1,_2>_> *)
                              &pIVar14[1].m_t0)->m_storage).m_data.array[0];
                    local_128.m_loop.m_entry.
                    super___shared_ptr<anurbs::Entry<anurbs::BrepLoop>,_(__gnu_cxx::_Lock_policy)2>.
                    _M_ptr = (element_type *)
                             (((PlainObjectBase<Eigen::Matrix<double,_1,_2,_1,_1,_2>_> *)
                              &pIVar14->m_t0)->m_storage).m_data.array[0];
                    local_128.m_loop.m_entry.
                    super___shared_ptr<anurbs::Entry<anurbs::BrepLoop>,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount._M_pi =
                         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)pIVar14->m_t1;
                    (**(code **)(*plVar4 + 0x38))
                              ((int)local_128.m_edge.m_entry.
                                    super___shared_ptr<anurbs::Entry<anurbs::BrepEdge>,_(__gnu_cxx::_Lock_policy)2>
                                    ._M_ptr,
                               local_128.m_loop.m_entry.
                               super___shared_ptr<anurbs::Entry<anurbs::BrepLoop>,_(__gnu_cxx::_Lock_policy)2>
                               ._M_refcount._M_pi,__args_2,plVar4,1);
                    dVar19 = *(double *)((long)local_128.m_domain.m_t1 + 0x40) *
                             *(double *)((long)local_128.m_domain.m_t1 + 0x20) -
                             *(double *)((long)local_128.m_domain.m_t1 + 0x28) *
                             *(double *)((long)local_128.m_domain.m_t1 + 0x38);
                    dVar18 = *(double *)((long)local_128.m_domain.m_t1 + 0x30) *
                             *(double *)((long)local_128.m_domain.m_t1 + 0x28) -
                             *(double *)((long)local_128.m_domain.m_t1 + 0x18) *
                             *(double *)((long)local_128.m_domain.m_t1 + 0x40);
                    dVar17 = *(double *)((long)local_128.m_domain.m_t1 + 0x18) *
                             *(double *)((long)local_128.m_domain.m_t1 + 0x38) -
                             *(double *)((long)local_128.m_domain.m_t1 + 0x30) *
                             *(double *)((long)local_128.m_domain.m_t1 + 0x20);
                    local_38 = SQRT(dVar17 * dVar17 + dVar18 * dVar18 + dVar19 * dVar19) *
                               (double)local_128.m_loop.m_entry.
                                       super___shared_ptr<anurbs::Entry<anurbs::BrepLoop>,_(__gnu_cxx::_Lock_policy)2>
                                       ._M_ptr;
                    std::
                    vector<std::tuple<double,double,double>,std::allocator<std::tuple<double,double,double>>>
                    ::emplace_back<double_const&,double_const&,double>
                              ((vector<std::tuple<double,double,double>,std::allocator<std::tuple<double,double,double>>>
                                *)__return_storage_ptr__,(double *)&local_128.m_edge,
                               (double *)
                               &local_128.m_loop.m_entry.
                                super___shared_ptr<anurbs::Entry<anurbs::BrepLoop>,_(__gnu_cxx::_Lock_policy)2>
                                ._M_refcount,&local_38);
                    if ((void *)local_128.m_domain.m_t1 != (void *)0x0) {
                      operator_delete((void *)local_128.m_domain.m_t1,
                                      local_e0 - (long)local_128.m_domain.m_t1);
                    }
                  }
                  if (local_158.
                      super__Vector_base<anurbs::Interval,_std::allocator<anurbs::Interval>_>.
                      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
                    operator_delete(local_158.
                                    super__Vector_base<anurbs::Interval,_std::allocator<anurbs::Interval>_>
                                    ._M_impl.super__Vector_impl_data._M_start,
                                    (long)local_158.
                                          super__Vector_base<anurbs::Interval,_std::allocator<anurbs::Interval>_>
                                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                                    (long)local_158.
                                          super__Vector_base<anurbs::Interval,_std::allocator<anurbs::Interval>_>
                                          ._M_impl.super__Vector_impl_data._M_start);
                  }
                  peVar11 = (element_type *)
                            &(peVar11->m_data).
                             super___shared_ptr<anurbs::NurbsCurveGeometry<2L>,_(__gnu_cxx::_Lock_policy)2>
                             ._M_refcount;
                  peVar12 = local_128.m_curve_geometry.m_entry.
                            super___shared_ptr<anurbs::Entry<anurbs::NurbsCurveGeometry<2L>_>,_(__gnu_cxx::_Lock_policy)2>
                            ._M_ptr;
                } while (peVar11 !=
                         (element_type *)
                         local_128.m_curve_geometry.m_entry.
                         super___shared_ptr<anurbs::Entry<anurbs::NurbsCurveGeometry<2L>_>,_(__gnu_cxx::_Lock_policy)2>
                         ._M_refcount._M_pi);
              }
              std::vector<anurbs::Polygon,_std::allocator<anurbs::Polygon>_>::~vector
                        ((vector<anurbs::Polygon,_std::allocator<anurbs::Polygon>_> *)&local_140);
              _Var15._M_pi = local_128.m_edge.m_entry.
                             super___shared_ptr<anurbs::Entry<anurbs::BrepEdge>,_(__gnu_cxx::_Lock_policy)2>
                             ._M_refcount._M_pi;
              dVar17 = local_128.m_domain.m_t0;
            }
          }
          _Var15._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                         ((long)&(((BrepFace *)_Var15._M_pi)->m_brep).m_entry.
                                 super___shared_ptr<anurbs::Entry<anurbs::Brep>,_(__gnu_cxx::_Lock_policy)2>
                                 ._M_ptr + 1);
          lVar13 = (long)local_d8.m_spans_v.
                         super__Vector_base<anurbs::Interval,_std::allocator<anurbs::Interval>_>.
                         _M_impl.super__Vector_impl_data._M_finish -
                   (long)local_d8.m_spans_v.
                         super__Vector_base<anurbs::Interval,_std::allocator<anurbs::Interval>_>.
                         _M_impl.super__Vector_impl_data._M_start >> 4;
          pIVar9 = local_d8.m_spans_u.
                   super__Vector_base<anurbs::Interval,_std::allocator<anurbs::Interval>_>._M_impl.
                   super__Vector_impl_data._M_finish;
          pIVar10 = local_d8.m_spans_v.
                    super__Vector_base<anurbs::Interval,_std::allocator<anurbs::Interval>_>._M_impl.
                    super__Vector_impl_data._M_finish;
          pIVar14 = local_d8.m_spans_v.
                    super__Vector_base<anurbs::Interval,_std::allocator<anurbs::Interval>_>._M_impl.
                    super__Vector_impl_data._M_start;
          pIVar16 = local_d8.m_spans_u.
                    super__Vector_base<anurbs::Interval,_std::allocator<anurbs::Interval>_>._M_impl.
                    super__Vector_impl_data._M_start;
        } while ((long)_Var15._M_pi < lVar13);
      }
      dVar17 = (double)((long)dVar17 + 1);
    } while ((long)dVar17 < (long)pIVar9 - (long)pIVar16 >> 4);
  }
  if (pIVar14 != (pointer)0x0) {
    operator_delete(pIVar14,(long)local_d8.m_spans_v.
                                  super__Vector_base<anurbs::Interval,_std::allocator<anurbs::Interval>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage - (long)pIVar14
                   );
    pIVar16 = local_d8.m_spans_u.
              super__Vector_base<anurbs::Interval,_std::allocator<anurbs::Interval>_>._M_impl.
              super__Vector_impl_data._M_start;
  }
  if (pIVar16 != (pointer)0x0) {
    operator_delete(pIVar16,(long)local_d8.m_spans_u.
                                  super__Vector_base<anurbs::Interval,_std::allocator<anurbs::Interval>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage - (long)pIVar16
                   );
  }
  std::
  vector<std::vector<anurbs::Polygon,_std::allocator<anurbs::Polygon>_>,_std::allocator<std::vector<anurbs::Polygon,_std::allocator<anurbs::Polygon>_>_>_>
  ::~vector(&local_d8.m_span_polygons);
  if (local_d8.m_span_trim_type.
      super__Vector_base<anurbs::TrimTypes,_std::allocator<anurbs::TrimTypes>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_d8.m_span_trim_type.
                    super__Vector_base<anurbs::TrimTypes,_std::allocator<anurbs::TrimTypes>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_d8.m_span_trim_type.
                          super__Vector_base<anurbs::TrimTypes,_std::allocator<anurbs::TrimTypes>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_d8.m_span_trim_type.
                          super__Vector_base<anurbs::TrimTypes,_std::allocator<anurbs::TrimTypes>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  std::
  vector<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>,_std::allocator<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>_>_>
  ::~vector(&local_d8.m_paths);
  return __return_storage_ptr__;
}

Assistant:

static IntegrationPointList<2> get(const BrepFace& face, const double tolerance)
    {
        TrimmedSurfaceClipping clipper(tolerance * 10, tolerance / 10);

        IntegrationPointList<2> integration_points;

        for (const auto loop : face.loops()) {
            clipper.begin_loop();

            for (const auto trim : loop->trims()) {
                clipper.add_curve(*trim->curve_2d());
            }

            clipper.end_loop();
        }

        const auto& surface_geometry = *face.surface_geometry().data();
        clipper.compute(surface_geometry.spans_u(), surface_geometry.spans_v());

        const auto degree_u = surface_geometry.degree_u();
        const auto degree_v = surface_geometry.degree_v();

        const auto degree = std::max(degree_u, degree_v) + 1;

        for (Index i = 0; i < clipper.nb_spans_u(); i++) {
            for (Index j = 0; j < clipper.nb_spans_v(); j++) {
                if (clipper.span_trim_type(i, j) == TrimTypes::Empty) {
                    continue;
                }

                if (clipper.span_trim_type(i, j) == TrimTypes::Full) {
                    const auto points = IntegrationPoints::get(degree_u + 1, degree_v + 1, clipper.span_u(i), clipper.span_v(j));

                    for (const auto [u, v, weight] : points) {
                        const auto ders = surface_geometry.derivatives_at(u, v, 1);

                        const auto n = cross(ders[1], ders[2]);

                        integration_points.emplace_back(u, v, weight * norm(n));
                    }
                } else {
                    const auto polygons = clipper.span_polygons(i, j);

                    for (const auto& polygon : polygons) {
                        const auto points = PolygonIntegrationPoints::get(degree, polygon);

                        for (const auto [u, v, weight] : points) {
                            const auto ders = surface_geometry.derivatives_at(u, v, 1);

                            const auto n = cross(ders[1], ders[2]);

                            integration_points.emplace_back(u, v, weight * norm(n));
                        }
                    }
                }
            }
        }

        return integration_points;
    }